

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O1

DecodeStatus
DecodeBlezGroupBranch_4(MCInst *MI,uint32_t insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  MCRegisterClass *pMVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = insn >> 0x10 & 0x1f;
  if (uVar2 == 0) {
    return MCDisassembler_Fail;
  }
  uVar3 = insn >> 0x15 & 0x1f;
  if (uVar3 == 0) {
    uVar3 = 0xfd;
  }
  else {
    if (uVar3 != uVar2) {
      MCInst_setOpcode(MI,0xd8);
      pMVar1 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Address,8);
      MCOperand_CreateReg0(MI,(uint)pMVar1->RegsBegin[uVar3]);
      goto LAB_002221fb;
    }
    uVar3 = 0xdc;
  }
  MCInst_setOpcode(MI,uVar3);
LAB_002221fb:
  pMVar1 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Address,8);
  MCOperand_CreateReg0(MI,(uint)pMVar1->RegsBegin[uVar2]);
  MCOperand_CreateImm0(MI,(ulong)(uint)((int)(short)insn << 2));
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeBlezGroupBranch_4(MCInst *MI, uint32_t insn,
		uint64_t Address, const MCRegisterInfo *Decoder)
{
	// If we are called then we can assume that MIPS32r6/MIPS64r6 is enabled
	// (otherwise we would have matched the BLEZL instruction from the earlier
	// ISA's instead).
	//
	// We have:
	//    0b000110 sssss ttttt iiiiiiiiiiiiiiii
	//      Invalid   if rs == 0
	//      BLEZALC   if rs == 0  && rt != 0
	//      BGEZALC   if rs == rt && rt != 0
	//      BGEUC     if rs != rt && rs != 0  && rt != 0

	uint32_t Rs = fieldFromInstruction(insn, 21, 5);
	uint32_t Rt = fieldFromInstruction(insn, 16, 5);
	uint32_t Imm = (uint32_t)SignExtend64(fieldFromInstruction(insn, 0, 16), 16) * 4;
	bool HasRs = false;

	if (Rt == 0)
		return MCDisassembler_Fail;
	else if (Rs == 0)
		MCInst_setOpcode(MI, Mips_BLEZALC);
	else if (Rs == Rt)
		MCInst_setOpcode(MI, Mips_BGEZALC);
	else {
		HasRs = true;
		MCInst_setOpcode(MI, Mips_BGEUC);
	}

	if (HasRs)
		MCOperand_CreateReg0(MI, getReg(Decoder, Mips_GPR32RegClassID, Rs));

	MCOperand_CreateReg0(MI, getReg(Decoder, Mips_GPR32RegClassID, Rt));

	MCOperand_CreateImm0(MI, Imm);

	return MCDisassembler_Success;
}